

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlog_is_on.cc
# Opt level: O0

bool google::glog_internal_namespace_::SafeFNMatch_
               (char *pattern,size_t patt_len,char *str,size_t str_len)

{
  bool bVar1;
  bool local_41;
  size_t local_40;
  size_t s;
  size_t p;
  size_t str_len_local;
  char *str_local;
  size_t patt_len_local;
  char *pattern_local;
  
  s = 0;
  local_40 = 0;
  while( true ) {
    if ((s == patt_len) && (local_40 == str_len)) {
      return true;
    }
    if (s == patt_len) {
      return false;
    }
    if (local_40 == str_len) break;
    if ((pattern[s] != str[local_40]) && (pattern[s] != '?')) {
      if (pattern[s] == '*') {
        if (s + 1 == patt_len) {
          pattern_local._7_1_ = true;
        }
        else {
          do {
            bVar1 = SafeFNMatch_(pattern + s + 1,patt_len - (s + 1),str + local_40,
                                 str_len - local_40);
            if (bVar1) {
              return true;
            }
            local_40 = local_40 + 1;
          } while (local_40 != str_len);
          pattern_local._7_1_ = false;
        }
      }
      else {
        pattern_local._7_1_ = false;
      }
      return pattern_local._7_1_;
    }
    s = s + 1;
    local_40 = local_40 + 1;
  }
  local_41 = false;
  if (s + 1 == patt_len) {
    local_41 = pattern[s] == '*';
  }
  return local_41;
}

Assistant:

GLOG_NO_EXPORT bool SafeFNMatch_(const char* pattern, size_t patt_len,
                                 const char* str, size_t str_len) {
  size_t p = 0;
  size_t s = 0;
  while (true) {
    if (p == patt_len && s == str_len) return true;
    if (p == patt_len) return false;
    if (s == str_len) return p + 1 == patt_len && pattern[p] == '*';
    if (pattern[p] == str[s] || pattern[p] == '?') {
      p += 1;
      s += 1;
      continue;
    }
    if (pattern[p] == '*') {
      if (p + 1 == patt_len) return true;
      do {
        if (SafeFNMatch_(pattern + (p + 1), patt_len - (p + 1), str + s,
                         str_len - s)) {
          return true;
        }
        s += 1;
      } while (s != str_len);
      return false;
    }
    return false;
  }
}